

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeGetAddress(ExpressionContext *ctx,SynGetAddress *syntax)

{
  int iVar1;
  ExprBase *pEVar2;
  undefined4 extraout_var;
  TypeBase *type;
  
  pEVar2 = AnalyzeExpression(ctx,syntax->value);
  if ((pEVar2->type != (TypeBase *)0x0) && (pEVar2->type->typeID == 0)) {
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    type = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprError::ExprError
              ((ExprError *)CONCAT44(extraout_var,iVar1),&syntax->super_SynBase,type,pEVar2);
    return &((ExprError *)CONCAT44(extraout_var,iVar1))->super_ExprBase;
  }
  pEVar2 = CreateGetAddress(ctx,&syntax->super_SynBase,pEVar2);
  return pEVar2;
}

Assistant:

ExprBase* AnalyzeGetAddress(ExpressionContext &ctx, SynGetAddress *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), value);

	return CreateGetAddress(ctx, syntax, value);
}